

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Trivia __thiscall
slang::parsing::Preprocessor::handleEndIfDirective(Preprocessor *this,Token directive)

{
  SourceRange range;
  undefined1 auVar1 [14];
  bool bVar2;
  SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *in_RDI;
  Trivia TVar3;
  undefined1 unaff_retaddr;
  ConditionalDirectiveExpressionSyntax *in_stack_00000008;
  Preprocessor *in_stack_00000010;
  Token in_stack_00000018;
  bool taken;
  undefined6 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9e;
  undefined6 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa6;
  SourceLocation in_stack_ffffffffffffffa8;
  Token *in_stack_ffffffffffffffb0;
  undefined2 uStack_2;
  
  bVar2 = SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::empty(in_RDI + 6);
  if (bVar2) {
    Token::range(in_stack_ffffffffffffffb0);
    range.startLoc._6_2_ = in_stack_ffffffffffffffa6;
    range.startLoc._0_6_ = in_stack_ffffffffffffffa0;
    range.endLoc = in_stack_ffffffffffffffa8;
    addDiag((Preprocessor *)CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98),
            SUB84((ulong)in_stack_ffffffffffffffb0 >> 0x20,0),range);
  }
  else {
    SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::pop_back(in_RDI);
    bVar2 = SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::empty(in_RDI + 6);
    if (!bVar2) {
      SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::back(in_RDI + 6);
    }
  }
  TVar3 = parseBranchDirective
                    (in_stack_00000010,in_stack_00000018,in_stack_00000008,(bool)unaff_retaddr);
  auVar1 = TVar3._0_14_;
  TVar3._14_2_ = uStack_2;
  TVar3.field_0 = (anon_union_12_4_39e54f29_for_Trivia_0)auVar1._0_12_;
  TVar3.hasFullLocation = (bool)auVar1[0xc];
  TVar3.kind = auVar1[0xd];
  return TVar3;
}

Assistant:

Trivia Preprocessor::handleEndIfDirective(Token directive) {
    // pop the active branch off the stack
    bool taken = true;
    if (branchStack.empty())
        addDiag(diag::UnexpectedConditionalDirective, directive.range());
    else {
        branchStack.pop_back();
        if (!branchStack.empty() && !branchStack.back().currentActive)
            taken = false;
    }
    return parseBranchDirective(directive, nullptr, taken);
}